

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.h
# Opt level: O1

Sets * __thiscall wasm::LocalGraph::getSets(LocalGraph *this,LocalGet *get)

{
  ulong uVar1;
  Sets *in_RAX;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  
  uVar1 = (this->getSetsMap)._M_h._M_bucket_count;
  uVar3 = (ulong)get % uVar1;
  p_Var4 = (this->getSetsMap)._M_h._M_buckets[uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4, (LocalGet *)p_Var4->_M_nxt[1]._M_nxt != get)) {
    while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var5 = p_Var4, (LocalGet *)p_Var2[1]._M_nxt == get)) goto LAB_0070d74e;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_0070d74e:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var5->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    if (getSets(wasm::LocalGet*)::empty == '\0') {
      getSets();
    }
    else {
      in_RAX = &getSets::empty;
    }
  }
  else {
    in_RAX = (Sets *)(p_Var2 + 2);
  }
  return in_RAX;
}

Assistant:

const Sets& getSets(LocalGet* get) const {
    auto iter = getSetsMap.find(get);
    if (iter == getSetsMap.end()) {
      // A missing entry means there is nothing there (and we saved a little
      // space by not putting something there).
      //
      // Use a canonical constant empty set to avoid allocation.
      static const Sets empty;
      return empty;
    }
    return iter->second;
  }